

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::
ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (ParserRefImpl<Catch::clara::detail::Arg> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ref,string *hint)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_ComposableParserImpl<Catch::clara::detail::Arg>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_00186d60;
  this->m_optionality = Optional;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00186d98;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00186de8;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)&p_Var2[1]._M_use_count = ref;
  (this->m_ref).super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var2 + 1);
  (this->m_ref).super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (this->m_hint)._M_dataplus._M_p = (pointer)&(this->m_hint).field_2;
  pcVar1 = (hint->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_hint,pcVar1,pcVar1 + hint->_M_string_length);
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

ParserRefImpl( T &ref, std::string const &hint )
        :   m_ref( std::make_shared<BoundValueRef<T>>( ref ) ),
            m_hint( hint )
        {}